

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O2

JavascriptNativeFloatArray *
Js::JavascriptArray::DeepCopyInstance<Js::JavascriptNativeFloatArray>
          (JavascriptNativeFloatArray *instance)

{
  bool bVar1;
  DynamicTypeHandler *this;
  type_info *ptVar2;
  Recycler *pRVar3;
  JavascriptNativeFloatArray *this_00;
  undefined1 local_40 [8];
  TrackAllocData data;
  
  this = DynamicObject::GetTypeHandler((DynamicObject *)instance);
  ptVar2 = (type_info *)DynamicTypeHandler::GetInlineSlotsSize(this);
  bVar1 = IsInlineSegment((instance->super_JavascriptNativeArray).super_JavascriptArray.head.ptr,
                          (JavascriptArray *)instance);
  if (bVar1) {
    ptVar2 = ptVar2 + (ulong)((instance->super_JavascriptNativeArray).super_JavascriptArray.head.ptr
                             )->size * 8 + 0x18;
  }
  pRVar3 = RecyclableObject::GetRecycler((RecyclableObject *)instance);
  local_40 = (undefined1  [8])&JavascriptNativeFloatArray::typeinfo;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_693dcf2;
  data.filename._0_4_ = 0x2f4f;
  data.typeinfo = ptVar2;
  pRVar3 = Memory::Recycler::TrackAllocInfo(pRVar3,(TrackAllocData *)local_40);
  this_00 = (JavascriptNativeFloatArray *)new<Memory::Recycler>(0x40,pRVar3,0x398e98,0);
  JavascriptNativeFloatArray::JavascriptNativeFloatArray(this_00,instance,true,true);
  return this_00;
}

Assistant:

T * JavascriptArray::DeepCopyInstance(T * instance)
    {
        size_t allocSize = instance->GetTypeHandler()->GetInlineSlotsSize();
        if (IsInlineSegment(instance->head, instance))
        {
            allocSize += sizeof(Js::SparseArraySegmentBase) + instance->head->size * sizeof(typename T::TElement);
        }

        return RecyclerNewPlusZ(instance->GetRecycler(), allocSize, T, instance, true /*boxHead*/, true /*deepCopy*/);
    }